

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bicubic_apply_interpolation.h
# Opt level: O3

void ncnn::gridsample_2d_bicubic_apply_interpolation_p4
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  float *pfVar1;
  int iVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  float *pfVar13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  float fVar18;
  float fVar24;
  float fVar26;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar28;
  undefined1 auVar22 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  __m128 value_f [4];
  float fVar17;
  float fVar23;
  float fVar25;
  float fVar27;
  
  iVar2 = dst->c;
  if (0 < (long)iVar2) {
    iVar8 = dst->h * dst->w;
    lVar10 = 0;
    do {
      if (0 < iVar8) {
        lVar11 = src->cstep * lVar10 * src->elemsize;
        pvVar3 = src->data;
        pfVar13 = (float *)offset_value->data;
        pauVar12 = (undefined1 (*) [16])(dst->cstep * lVar10 * dst->elemsize + (long)dst->data);
        iVar9 = 0;
        do {
          fVar18 = *pfVar13;
          fVar24 = pfVar13[1];
          fVar26 = fVar18 + 1.0;
          fVar30 = 1.0 - fVar18;
          fVar26 = ((fVar26 * -0.75 + 3.75) * fVar26 + -6.0) * fVar26 + 3.0;
          auVar16 = vshufps_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26),0);
          fVar28 = (fVar18 * 1.25 + -2.25) * fVar18 * fVar18;
          auVar22 = ZEXT416((uint)(fVar28 + 1.0));
          auVar22 = vshufps_avx(auVar22,auVar22,0);
          fVar18 = (fVar30 * 1.25 + -2.25) * fVar30 * fVar30 + 1.0;
          auVar4 = vshufps_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18),0);
          auVar19 = ZEXT416((uint)(fVar26 + fVar18 + fVar28));
          auVar19 = vshufps_avx(auVar19,auVar19,0);
          fVar18 = fVar24 + 1.0;
          fVar26 = 1.0 - fVar24;
          auVar20 = ZEXT416((uint)(((3.75 - fVar18 * 0.75) * fVar18 + -6.0) * fVar18));
          auVar20 = vshufps_avx(auVar20,auVar20,0);
          fVar24 = (fVar24 * 1.25 + -2.25) * fVar24 * fVar24;
          auVar5 = vshufps_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),0);
          fVar18 = fVar26 * fVar26 * (fVar26 * 1.25 + -2.25) + 1.0;
          auVar6 = vshufps_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18),0);
          auVar7 = vshufps_avx(ZEXT416((uint)(fVar18 + fVar24)),ZEXT416((uint)(fVar18 + fVar24)),0);
          lVar14 = 0;
          do {
            lVar15 = (long)*(int *)((long)pfVar13 + lVar14 + 8);
            fVar18 = 0.0;
            fVar24 = 0.0;
            fVar26 = 0.0;
            fVar28 = 0.0;
            fVar30 = 0.0;
            fVar31 = 0.0;
            fVar32 = 0.0;
            fVar33 = 0.0;
            if (-1 < lVar15) {
              pfVar1 = (float *)((long)pvVar3 + lVar15 * 4 + lVar11);
              fVar30 = *pfVar1;
              fVar31 = pfVar1[1];
              fVar32 = pfVar1[2];
              fVar33 = pfVar1[3];
            }
            lVar15 = (long)*(int *)((long)pfVar13 + lVar14 + 0xc);
            if (-1 < lVar15) {
              pfVar1 = (float *)((long)pvVar3 + lVar15 * 4 + lVar11);
              fVar18 = *pfVar1;
              fVar24 = pfVar1[1];
              fVar26 = pfVar1[2];
              fVar28 = pfVar1[3];
            }
            lVar15 = (long)*(int *)((long)pfVar13 + lVar14 + 0x10);
            fVar17 = 0.0;
            fVar23 = 0.0;
            fVar25 = 0.0;
            fVar27 = 0.0;
            fVar34 = 0.0;
            fVar35 = 0.0;
            fVar36 = 0.0;
            fVar37 = 0.0;
            if (-1 < lVar15) {
              pfVar1 = (float *)((long)pvVar3 + lVar15 * 4 + lVar11);
              fVar34 = *pfVar1;
              fVar35 = pfVar1[1];
              fVar36 = pfVar1[2];
              fVar37 = pfVar1[3];
            }
            lVar15 = (long)*(int *)((long)pfVar13 + lVar14 + 0x14);
            if (-1 < lVar15) {
              pfVar1 = (float *)((long)pvVar3 + lVar15 * 4 + lVar11);
              fVar17 = *pfVar1;
              fVar23 = pfVar1[1];
              fVar25 = pfVar1[2];
              fVar27 = pfVar1[3];
            }
            auVar21._0_4_ = auVar19._0_4_ * fVar17;
            auVar21._4_4_ = auVar19._4_4_ * fVar23;
            auVar21._8_4_ = auVar19._8_4_ * fVar25;
            auVar21._12_4_ = auVar19._12_4_ * fVar27;
            auVar29._0_4_ = fVar34 * auVar4._0_4_ + fVar30 * auVar16._0_4_ + auVar22._0_4_ * fVar18;
            auVar29._4_4_ = fVar35 * auVar4._4_4_ + fVar31 * auVar16._4_4_ + auVar22._4_4_ * fVar24;
            auVar29._8_4_ = fVar36 * auVar4._8_4_ + fVar32 * auVar16._8_4_ + auVar22._8_4_ * fVar26;
            auVar29._12_4_ =
                 fVar37 * auVar4._12_4_ + fVar33 * auVar16._12_4_ + auVar22._12_4_ * fVar28;
            auVar21 = vsubps_avx(auVar29,auVar21);
            *(undefined1 (*) [16])((long)&local_58 + lVar14) = auVar21;
            lVar14 = lVar14 + 0x10;
          } while (lVar14 != 0x40);
          fVar18 = auVar20._0_4_ + 3.0;
          fVar24 = auVar20._4_4_ + 3.0;
          fVar26 = auVar20._8_4_ + 3.0;
          fVar28 = auVar20._12_4_ + 3.0;
          auVar16._0_4_ =
               (auVar5._0_4_ + 1.0) * fStack_48 + fVar18 * local_58 + auVar6._0_4_ * value_f[0][2];
          auVar16._4_4_ =
               (auVar5._4_4_ + 1.0) * fStack_44 + fVar24 * fStack_54 + auVar6._4_4_ * value_f[0][3];
          auVar16._8_4_ =
               (auVar5._8_4_ + 1.0) * value_f[0][0] + fVar26 * fStack_50 +
               auVar6._8_4_ * value_f[1][0];
          auVar16._12_4_ =
               (auVar5._12_4_ + 1.0) * value_f[0][1] + fVar28 * fStack_4c +
               auVar6._12_4_ * value_f[1][1];
          auVar22._0_4_ = (fVar18 + auVar7._0_4_) * value_f[1][2];
          auVar22._4_4_ = (fVar24 + auVar7._4_4_) * value_f[1][3];
          auVar22._8_4_ = (fVar26 + auVar7._8_4_) * value_f[2][0];
          auVar22._12_4_ = (fVar28 + auVar7._12_4_) * value_f[2][1];
          auVar16 = vsubps_avx(auVar16,auVar22);
          *pauVar12 = auVar16;
          pauVar12 = pauVar12 + 1;
          pfVar13 = pfVar13 + 0x12;
          iVar9 = iVar9 + 1;
        } while (iVar9 != iVar8);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  return;
}

Assistant:

static void gridsample_2d_bicubic_apply_interpolation_p4(const Mat& src, Mat& dst, Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    __m128 x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3;
    __m128 y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3;
    __m128 value_f[4];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            cubic_interp1d_p4(x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3, _mm_set_ps1(offset_value_ptr[0]));
            cubic_interp1d_p4(y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3, _mm_set_ps1(offset_value_ptr[1]));

            const int* offset_ptr = (int*)offset_value_ptr + 2;

            for (int ii = 0; ii < 4; ii++)
            {
                __m128 x0_val = offset_ptr[0] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[0]) : _mm_set1_ps(0);
                __m128 x1_val = offset_ptr[1] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[1]) : _mm_set1_ps(0);
                __m128 x2_val = offset_ptr[2] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[2]) : _mm_set1_ps(0);
                __m128 x3_val = offset_ptr[3] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[3]) : _mm_set1_ps(0);

                value_f[ii] = _mm_mul_ps(x_coeffs0, x0_val);
                value_f[ii] = _mm_comp_fmadd_ps(x_coeffs1, x1_val, value_f[ii]);
                value_f[ii] = _mm_comp_fmadd_ps(x_coeffs2, x2_val, value_f[ii]);
                value_f[ii] = _mm_comp_fmadd_ps(x_coeffs3, x3_val, value_f[ii]);

                offset_ptr += 4;
            }

            __m128 _v = _mm_mul_ps(y_coeffs0, value_f[0]);
            _v = _mm_comp_fmadd_ps(y_coeffs1, value_f[1], _v);
            _v = _mm_comp_fmadd_ps(y_coeffs2, value_f[2], _v);
            _v = _mm_comp_fmadd_ps(y_coeffs3, value_f[3], _v);
            _mm_storeu_ps(dstptr, _v);

            dstptr += 4;
            offset_value_ptr += 18;
        }
    }
}